

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ska2anm.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint32 uVar3;
  int iVar4;
  undefined4 extraout_var;
  Animation *this;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX;
  char **ppcVar5;
  char *pcVar6;
  char *pcVar7;
  StreamFile stream;
  StreamFile local_40;
  
  ppcVar5 = argv;
  rw::Engine::init((Engine *)0x0,(EVP_PKEY_CTX *)argv);
  iVar4 = (int)ppcVar5;
  rw::registerHAnimPlugin();
  rw::Engine::open((char *)0x0,iVar4);
  rw::Engine::start();
  if (argv0 == (char *)0x0) {
    argv0 = *argv;
  }
  do {
    ppcVar5 = argv + 1;
    iVar4 = argc + -1;
    pcVar6 = argv[1];
    if ((pcVar6 == (char *)0x0) || (*pcVar6 != '-')) break;
    pcVar7 = pcVar6 + 1;
    if (pcVar6[1] == '-') {
      if (pcVar6[2] != '\0') goto LAB_00105d65;
      argc = argc + -2;
      argv = argv + 2;
      bVar1 = false;
    }
    else {
      if (pcVar6[1] == '\0') break;
LAB_00105d65:
      while (argc = iVar4, *pcVar7 == 'v') {
        if (pcVar7[1] == '\0') {
          pcVar7 = ppcVar5[1];
          if (pcVar7 == (char *)0x0) goto LAB_00105ed3;
          ppcVar5 = ppcVar5 + 1;
          argc = argc + -1;
        }
        else {
          pcVar7 = pcVar7 + 1;
        }
        __isoc99_sscanf(pcVar7,"%x",&rw::version);
        iVar4 = argc;
        pcVar7 = "";
      }
      if (*pcVar7 != '\0') goto LAB_00105ed3;
      bVar1 = true;
      argv = ppcVar5;
    }
    ppcVar5 = argv;
    iVar4 = argc;
  } while (bVar1);
  if (0 < iVar4) {
    local_40.super_Stream._vptr_Stream = (_func_int **)&PTR__Stream_00147c68;
    local_40.file = (void *)0x0;
    iVar2 = rw::StreamFile::open(&local_40,*ppcVar5,0x13203f);
    if (CONCAT44(extraout_var,iVar2) == 0) {
      main_cold_2();
    }
    else {
      uVar3 = rw::Stream::readU32(&local_40.super_Stream);
      iVar2 = 0;
      rw::StreamFile::seek(&local_40,0,0);
      if (uVar3 == 0x1b) {
        iVar2 = 0x1b;
        bVar1 = rw::findChunk(&local_40.super_Stream,0x1b,(uint32 *)0x0,(uint32 *)0x0);
        if (bVar1) {
          this = rw::Animation::streamRead(&local_40.super_Stream);
        }
        else {
          this = (Animation *)0x0;
        }
      }
      else {
        this = rw::Animation::streamReadLegacy(&local_40.super_Stream);
      }
      rw::StreamFile::close(&local_40,iVar2);
      if (this == (Animation *)0x0) {
        main_cold_1();
      }
      else {
        if (iVar4 == 1) {
          pcVar6 = "out.anm";
          if (uVar3 == 0x1b) {
            pcVar6 = "out.ska";
          }
        }
        else {
          pcVar6 = ppcVar5[1];
        }
        iVar4 = rw::StreamFile::open(&local_40,pcVar6,0x13208b);
        if (CONCAT44(extraout_var_00,iVar4) != 0) {
          if (uVar3 == 0x1b) {
            rw::Animation::streamWriteLegacy(this,&local_40.super_Stream);
          }
          else {
            rw::Animation::streamWrite(this,&local_40.super_Stream);
          }
          rw::Animation::destroy(this);
          return 0;
        }
        fprintf(_stderr,"Error: couldn\'t open %s\n",pcVar6);
      }
    }
    return 1;
  }
LAB_00105ed3:
  usage();
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int
main(int argc, char *argv[])
{
	rw::Engine::init();
	rw::registerHAnimPlugin();
	rw::Engine::open(nil);
	rw::Engine::start();

	ARGBEGIN{
	case 'v':
		sscanf(EARGF(usage()), "%x", &rw::version);
		break;
	default:
		usage();
	}